

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O3

void * MpiReadRemoteMemory(CP_Services Svcs,DP_RS_Stream Stream_v,int Rank,size_t TimeStep,
                          size_t Offset,size_t Length,void *Buffer,void *DP_TimeStepInfo)

{
  long lVar1;
  CManager p_Var2;
  int *piVar3;
  long lVar4;
  bool bVar5;
  _MpiReadRequestMsg ReadRequestMsg;
  
  p_Var2 = (*Svcs->getCManager)(*Stream_v);
  piVar3 = (int *)calloc(0x50,1);
  lVar1 = *(long *)((long)Stream_v + 0x80);
  lVar4 = (long)Rank * 0x50;
  (*Svcs->verbose)(*Stream_v,5,
                   "Reader (rank %d) requesting to read remote memory for TimeStep %d from Rank %d, StreamWPR =%p, Offset=%d, Length=%d\n"
                   ,(ulong)*(uint *)((long)Stream_v + 8),TimeStep,(long)Rank,
                   *(undefined8 *)(lVar1 + 0x40 + lVar4),Offset,Length);
  ReadRequestMsg.NotifyCondition = CMCondition_get(p_Var2,0);
  ReadRequestMsg.RequestingRank = *(int *)((long)Stream_v + 8);
  ReadRequestMsg.StreamWPR = *(void **)(lVar1 + 0x40 + lVar4);
  *(size_t *)(piVar3 + 4) = Length;
  *(size_t *)(piVar3 + 6) = Offset;
  *piVar3 = ReadRequestMsg.NotifyCondition;
  piVar3[1] = ReadRequestMsg.RequestingRank;
  *(size_t *)(piVar3 + 2) = TimeStep;
  *(DP_RS_Stream *)(piVar3 + 8) = Stream_v;
  *(void **)(piVar3 + 10) = ReadRequestMsg.StreamWPR;
  *(void **)(piVar3 + 0x10) = Buffer;
  *(CManager *)(piVar3 + 0xc) = p_Var2;
  *(undefined8 *)(piVar3 + 0xe) = *Stream_v;
  piVar3[0x12] = Rank;
  bVar5 = *(long *)(lVar1 + 0x48 + lVar4) == *(long *)((long)Stream_v + 0x10);
  piVar3[0x13] = (uint)bVar5;
  if (!bVar5) {
    ReadRequestMsg.TimeStep = TimeStep;
    ReadRequestMsg.Length = Length;
    ReadRequestMsg.Offset = Offset;
    ReadRequestMsg.StreamRS = Stream_v;
    CMCondition_set_client_data(p_Var2,ReadRequestMsg.NotifyCondition,piVar3);
    (*Svcs->sendToPeer)(*Stream_v,*(CP_PeerCohort *)((long)Stream_v + 0x20),Rank,
                        *(CMFormat *)((long)Stream_v + 0x30),&ReadRequestMsg);
    (*Svcs->verbose)(*Stream_v,5,"ReadRemoteMemory: Send to server, Link.CohortSize=%d\n",
                     (ulong)*(uint *)((long)Stream_v + 0x18));
  }
  return piVar3;
}

Assistant:

static void *MpiReadRemoteMemory(CP_Services Svcs, DP_RS_Stream Stream_v, int Rank, size_t TimeStep,
                                 size_t Offset, size_t Length, void *Buffer, void *DP_TimeStepInfo)
{
    /* DP_RS_Stream is the return from InitReader */
    MpiStreamRD Stream = (MpiStreamRD)Stream_v;
    CManager cm = Svcs->getCManager(Stream->Stream.CP_Stream);
    MpiCompletionHandle ret = calloc(sizeof(struct _MpiCompletionHandle), 1);

    MpiWriterContactInfo TargetContact = &Stream->CohortWriterInfo[Rank];

    Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose,
                  "Reader (rank %d) requesting to read remote memory for TimeStep %d "
                  "from Rank %d, StreamWPR =%p, Offset=%d, Length=%d\n",
                  Stream->Stream.Rank, TimeStep, Rank, TargetContact->StreamWPR, Offset, Length);

    /* send request to appropriate writer */
    struct _MpiReadRequestMsg ReadRequestMsg = {.Length = Length,
                                                .NotifyCondition = CMCondition_get(cm, NULL),
                                                .Offset = Offset,
                                                .RequestingRank = Stream->Stream.Rank,
                                                .StreamRS = Stream,
                                                .StreamWPR = TargetContact->StreamWPR,
                                                .TimeStep = TimeStep};

    ret->ReadRequest = ReadRequestMsg;
    ret->Buffer = Buffer;
    ret->cm = cm;
    ret->CPStream = Stream->Stream.CP_Stream;
    ret->DestinationRank = Rank;
    ret->CommType = (TargetContact->taskID == Stream->Stream.taskID) ? MPI_DP_LOCAL : MPI_DP_REMOTE;

    if (ret->CommType == MPI_DP_REMOTE)
    {
        CMCondition_set_client_data(cm, ReadRequestMsg.NotifyCondition, ret);
        Svcs->sendToPeer(Stream->Stream.CP_Stream, Stream->Link.PeerCohort, Rank,
                         Stream->ReadRequestFormat, &ReadRequestMsg);

        Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose,
                      "ReadRemoteMemory: Send to server, Link.CohortSize=%d\n",
                      Stream->Link.CohortSize);
    }

    return ret;
}